

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilCanon.c
# Opt level: O1

void Map_Var4Test(void)

{
  int iVar1;
  uint uTruth;
  char *pfRes;
  uint *ptRes;
  char *pCounters;
  char **uPhases;
  unsigned_short *uCanons;
  int local_4c;
  char *local_48;
  uint *local_40;
  char *local_38;
  char **local_30;
  unsigned_short *local_28;
  
  Extra_Truth4VarN(&local_28,&local_30,&local_38,0x10);
  iVar1 = 0;
  do {
    local_4c = iVar1;
    Extra_TruthCanonN_rec(4,(uchar *)&local_4c,&local_40,&local_48,0);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x10000);
  return;
}

Assistant:

void Map_Var4Test()
{
    extern void Extra_Truth4VarN( unsigned short ** puCanons, char *** puPhases, char ** ppCounters, int PhaseMax );

    unsigned short * uCanons;
    char ** uPhases;
    char * pCounters;
    int i;
    unsigned * ptRes;
    char * pfRes;
    unsigned uTruth;
    int Count;

    Extra_Truth4VarN( &uCanons, &uPhases, &pCounters, 16 );

    for ( i = 0; i < 256*256; i++ )
    {
        uTruth = i;
        Count =  Extra_TruthCanonFastN( 5, 4, &uTruth, &ptRes, &pfRes );
    }
}